

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O1

void tcg_gen_deposit_i64_mips64el
               (TCGContext_conflict6 *tcg_ctx,TCGv_i64 ret,TCGv_i64 arg1,TCGv_i64 arg2,uint ofs,
               uint len)

{
  TCGOp *pTVar1;
  TCGTemp *pTVar2;
  ulong arg2_00;
  uintptr_t o_6;
  TCGv_i64 ret_00;
  uintptr_t o;
  uintptr_t o_1;
  
  if (len == 0x40) {
    if (ret != arg2) {
      pTVar1 = tcg_emit_op_mips64el(tcg_ctx,INDEX_op_mov_i64);
      pTVar1->args[0] = (TCGArg)(ret + (long)tcg_ctx);
      pTVar1->args[1] = (TCGArg)(arg2 + (long)tcg_ctx);
    }
  }
  else {
    if ((len != 0x10 || ofs != 0) && (ofs != 8 && ofs != 0 || len != 8)) {
      pTVar2 = tcg_temp_new_internal_mips64el(tcg_ctx,TCG_TYPE_I64,false);
      ret_00 = (TCGv_i64)((long)pTVar2 - (long)tcg_ctx);
      if (ofs + len == 0x40) {
        tcg_gen_shli_i64_mips64el(tcg_ctx,ret_00,arg1,(ulong)len);
        tcg_gen_extract2_i64_mips64el(tcg_ctx,ret,ret_00,arg2,len);
      }
      else if (ofs == 0) {
        tcg_gen_extract2_i64_mips64el(tcg_ctx,ret,arg1,arg2,len);
        tcg_gen_rotli_i64_mips64el(tcg_ctx,ret,ret,len);
      }
      else {
        arg2_00 = ~(-1L << ((byte)len & 0x3f));
        tcg_gen_andi_i64_mips64el(tcg_ctx,ret_00,arg2,arg2_00);
        tcg_gen_shli_i64_mips64el(tcg_ctx,ret_00,ret_00,(ulong)ofs);
        tcg_gen_andi_i64_mips64el(tcg_ctx,ret,arg1,~(arg2_00 << ((byte)ofs & 0x3f)));
        pTVar1 = tcg_emit_op_mips64el(tcg_ctx,INDEX_op_or_i64);
        pTVar1->args[0] = (TCGArg)(ret + (long)tcg_ctx);
        pTVar1->args[1] = (TCGArg)(ret + (long)tcg_ctx);
        pTVar1->args[2] = (TCGArg)pTVar2;
      }
      tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
      return;
    }
    pTVar1 = tcg_emit_op_mips64el(tcg_ctx,INDEX_op_deposit_i64);
    pTVar1->args[0] = (TCGArg)(ret + (long)tcg_ctx);
    pTVar1->args[1] = (TCGArg)(arg1 + (long)tcg_ctx);
    pTVar1->args[2] = (TCGArg)(arg2 + (long)tcg_ctx);
    pTVar1->args[3] = (ulong)ofs;
    pTVar1->args[4] = (ulong)len;
  }
  return;
}

Assistant:

void tcg_gen_deposit_i64(TCGContext *tcg_ctx, TCGv_i64 ret, TCGv_i64 arg1, TCGv_i64 arg2,
                         unsigned int ofs, unsigned int len)
{
    uint64_t mask;
    TCGv_i64 t1;

    tcg_debug_assert(ofs < 64);
    tcg_debug_assert(len > 0);
    tcg_debug_assert(len <= 64);
    tcg_debug_assert(ofs + len <= 64);

    if (len == 64) {
        tcg_gen_mov_i64(tcg_ctx, ret, arg2);
        return;
    }

#if TCG_TARGET_HAS_deposit_i64
    if (TCG_TARGET_deposit_i64_valid(ofs, len)) {
        tcg_gen_op5ii_i64(tcg_ctx, INDEX_op_deposit_i64, ret, arg1, arg2, ofs, len);
        return;
    }
#endif

#if TCG_TARGET_REG_BITS == 32
        if (ofs >= 32) {
            tcg_gen_deposit_i32(tcg_ctx, TCGV_HIGH(tcg_ctx, ret), TCGV_HIGH(tcg_ctx, arg1),
                                TCGV_LOW(tcg_ctx, arg2), ofs - 32, len);
            tcg_gen_mov_i32(tcg_ctx, TCGV_LOW(tcg_ctx, ret), TCGV_LOW(tcg_ctx, arg1));
            return;
        }
        if (ofs + len <= 32) {
            tcg_gen_deposit_i32(tcg_ctx, TCGV_LOW(tcg_ctx, ret), TCGV_LOW(tcg_ctx, arg1),
                                TCGV_LOW(tcg_ctx, arg2), ofs, len);
            tcg_gen_mov_i32(tcg_ctx, TCGV_HIGH(tcg_ctx, ret), TCGV_HIGH(tcg_ctx, arg1));
            return;
        }
#endif

    t1 = tcg_temp_new_i64(tcg_ctx);

#if TCG_TARGET_HAS_extract2_i64
        if (ofs + len == 64) {
            tcg_gen_shli_i64(tcg_ctx, t1, arg1, len);
            tcg_gen_extract2_i64(tcg_ctx, ret, t1, arg2, len);
            goto done;
        }
        if (ofs == 0) {
            tcg_gen_extract2_i64(tcg_ctx, ret, arg1, arg2, len);
            tcg_gen_rotli_i64(tcg_ctx, ret, ret, len);
            goto done;
        }
#endif

    mask = (1ull << len) - 1;
    if (ofs + len < 64) {
        tcg_gen_andi_i64(tcg_ctx, t1, arg2, mask);
        tcg_gen_shli_i64(tcg_ctx, t1, t1, ofs);
    } else {
        tcg_gen_shli_i64(tcg_ctx, t1, arg2, ofs);
    }
    tcg_gen_andi_i64(tcg_ctx, ret, arg1, ~(mask << ofs));
    tcg_gen_or_i64(tcg_ctx, ret, ret, t1);
#if TCG_TARGET_HAS_extract2_i64
 done:
#endif
    tcg_temp_free_i64(tcg_ctx, t1);
}